

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_predict_hbd_4x4_c(int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  int iVar1;
  int i;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      iVar3 = pred_buf_q3[lVar2] * alpha_q3;
      if (iVar3 < 0) {
        uVar4 = -(0x20U - iVar3 >> 6);
      }
      else {
        uVar4 = iVar3 + 0x20U >> 6;
      }
      iVar3 = dst[lVar2] + uVar4;
      if (bd == 10) {
        if (0x3fe < iVar3) {
          iVar3 = 0x3ff;
        }
      }
      else if (bd == 0xc) {
        if (0xffe < iVar3) {
          iVar3 = 0xfff;
        }
      }
      else if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      dst[lVar2] = (uint16_t)iVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    pred_buf_q3 = pred_buf_q3 + 0x20;
    iVar1 = iVar1 + 1;
    dst = dst + dst_stride;
  } while (iVar1 != 4);
  return;
}

Assistant:

static void cfl_compute_parameters(MACROBLOCKD *const xd, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  // Do not call cfl_compute_parameters multiple time on the same values.
  assert(cfl->are_parameters_computed == 0);

  cfl_pad(cfl, tx_size_wide[tx_size], tx_size_high[tx_size]);
  cfl_get_subtract_average_fn(tx_size)(cfl->recon_buf_q3, cfl->ac_buf_q3);
  cfl->are_parameters_computed = 1;
}